

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O2

int timespec_diff(timespec *res,timespec *a,timespec *b)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  iVar5 = -1;
  if (((b != (timespec *)0x0 && a != (timespec *)0x0) && (lVar1 = a->tv_sec, lVar1 != 0)) &&
     (uVar2 = b->tv_sec, uVar2 != 0)) {
    lVar3 = a->tv_nsec;
    lVar4 = b->tv_nsec;
    lVar6 = lVar3 + 1000000000;
    if (lVar4 <= lVar3) {
      lVar6 = lVar3;
    }
    uVar7 = ~uVar2;
    if (lVar4 <= lVar3) {
      uVar7 = -uVar2;
    }
    res->tv_nsec = lVar6 - lVar4;
    res->tv_sec = lVar1 + uVar7;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int timespec_diff(struct timespec *res, struct timespec *a, struct timespec *b)
{
	uint32_t billion = 1e9;

	if (!a || !b)
		return -1;
	if (a->tv_sec == 0 || b->tv_sec == 0)
		return -1;

	if (a->tv_nsec < b->tv_nsec) {
		res->tv_nsec = b->tv_nsec - a->tv_nsec;
		res->tv_nsec = billion - res->tv_nsec;
		res->tv_sec = a->tv_sec - 1 - b->tv_sec;

	} else {
		res->tv_nsec = a->tv_nsec - b->tv_nsec;
		res->tv_sec = a->tv_sec - b->tv_sec;
	}

	return 0;
}